

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getUntilRx(Nibbler *this,string *regex,string *result)

{
  bool bVar1;
  reference pvVar2;
  string local_138 [32];
  string local_118 [48];
  string local_e8;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> end;
  vector<int,_std::allocator<int>_> start;
  RX r;
  string *result_local;
  string *regex_local;
  Nibbler *this_local;
  
  if (this->_cursor < this->_length) {
    RX::RX((RX *)&start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,regex,true);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_c8);
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)this);
    bVar1 = RX::match((RX *)&start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                      (vector<int,_std::allocator<int>_> *)
                      &end.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<int,_std::allocator<int>_> *)local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)
                 &end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,0);
      std::__cxx11::string::substr((ulong)local_118,(ulong)this);
      std::__cxx11::string::operator=((string *)result,local_118);
      std::__cxx11::string::~string(local_118);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &end.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      this->_cursor = (long)*pvVar2 + this->_cursor;
    }
    else {
      std::__cxx11::string::substr((ulong)local_138,(ulong)this);
      std::__cxx11::string::operator=((string *)result,local_138);
      std::__cxx11::string::~string(local_138);
      this->_cursor = this->_length;
    }
    this_local._7_1_ = true;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    RX::~RX((RX *)&start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Nibbler::getUntilRx (const std::string& regex, std::string& result)
{
  if (_cursor < _length)
  {
    RX r (regex, true);
    std::vector <int> start;
    std::vector <int> end;
    if (r.match (start, end, _input.substr (_cursor)))
    {
      result = _input.substr (_cursor, start[0]);
      _cursor += start[0];
    }
    else
    {
      result = _input.substr (_cursor);
      _cursor = _length;
    }

    return true;
  }

  return false;
}